

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_free_list_rem(Tree *this,size_t i)

{
  NodeData *pNVar1;
  
  if (this->m_free_head == i) {
    pNVar1 = _p(this,i);
    this->m_free_head = pNVar1->m_next_sibling;
  }
  _rem_hierarchy(this,i);
  return;
}

Assistant:

void Tree::_free_list_rem(size_t i)
{
    if(m_free_head == i)
        m_free_head = _p(i)->m_next_sibling;
    _rem_hierarchy(i);
}